

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

void __thiscall FWeaponSlot::Sort(FWeaponSlot *this)

{
  int iVar1;
  PClassWeapon *pPVar2;
  int i;
  long lVar3;
  long lVar4;
  WeaponInfo *pWVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  
  lVar3 = 1;
  lVar4 = 0x10;
  do {
    if ((int)(this->Weapons).Count <= lVar3) {
      return;
    }
    pWVar5 = (this->Weapons).Array;
    iVar1 = pWVar5[lVar3].Position;
    pPVar2 = pWVar5[lVar3].Type;
    lVar8 = lVar4;
    for (lVar7 = lVar3; 0 < lVar7; lVar7 = lVar7 + -1) {
      if (*(int *)((long)pWVar5 + lVar8 + -8) <= iVar1) goto LAB_004a2f89;
      puVar6 = (undefined8 *)((long)&pWVar5->Type + lVar8);
      *puVar6 = puVar6[-2];
      puVar6[1] = puVar6[-1];
      pWVar5 = (this->Weapons).Array;
      lVar8 = lVar8 + -0x10;
    }
    lVar7 = 0;
LAB_004a2f89:
    pWVar5[(int)lVar7].Type = pPVar2;
    pWVar5[(int)lVar7].Position = iVar1;
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x10;
  } while( true );
}

Assistant:

void FWeaponSlot::Sort()
{
	// This does not use qsort(), because the sort should be stable, and
	// there is no guarantee that qsort() is stable. This insertion sort
	// should be fine.
	int i, j;

	for (i = 1; i < (int)Weapons.Size(); ++i)
	{
		int pos = Weapons[i].Position;
		PClassWeapon *type = Weapons[i].Type;
		for (j = i - 1; j >= 0 && Weapons[j].Position > pos; --j)
		{
			Weapons[j + 1] = Weapons[j];
		}
		Weapons[j + 1].Type = type;
		Weapons[j + 1].Position = pos;
	}
}